

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_SetPointerPluginTest_installTwoFunctionPointer_Test::
TEST_SetPointerPluginTest_installTwoFunctionPointer_Test
          (TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_ = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).output_ = (StringBufferTestOutput *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).plugin_ = (SetPointerPlugin *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_ = (TestResult *)0x0;
  TEST_GROUP_CppUTestGroupSetPointerPluginTest::TEST_GROUP_CppUTestGroupSetPointerPluginTest
            (&this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest);
  (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_003548c8;
  return;
}

Assistant:

TEST(SetPointerPluginTest, installTwoFunctionPointer)
{
    FunctionPointerUtestShell *tst = new FunctionPointerUtestShell();

    fp1 = orig_func1;
    fp2 = orig_func2;
    myRegistry_->addTest(tst);
    myRegistry_->runAllTests(*result_);
    CHECK(fp1 == orig_func1);
    CHECK(fp2 == orig_func2);
    LONGS_EQUAL(0, result_->getFailureCount());
    LONGS_EQUAL(2, result_->getCheckCount());
    delete tst;
}